

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O3

FArchive * __thiscall FArchive::ReadObject(FArchive *this,DObject **obj,PClass *wanttype)

{
  code cVar1;
  DObject *pDVar2;
  ulong in_RAX;
  PClass *pPVar3;
  DObject *this_00;
  Node *pNVar4;
  DObject *pDVar5;
  DObject *pDVar6;
  DWORD count;
  uint uVar7;
  byte bVar8;
  int ofs;
  BYTE playerNum;
  BYTE in;
  BYTE objHead;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,(long)&uStack_38 + 7,1);
  switch(uStack_38._7_1_) {
  case '\x02':
    goto switchD_004d73de_caseD_2;
  case '\x03':
    uVar7 = 0;
    bVar8 = 0;
    do {
      (*this->_vptr_FArchive[3])(this,(long)&uStack_38 + 6,1);
      uVar7 = uVar7 | (uStack_38._6_1_ & 0x7f) << (bVar8 & 0x1f);
      bVar8 = bVar8 + 7;
    } while ((char)uStack_38._6_1_ < '\0');
    if ((this->ArchiveToObject).Count <= uVar7) {
      I_Error("Object reference too high (%u; max is %u)\n",(ulong)uVar7);
    }
    *obj = (this->ArchiveToObject).Array[uVar7];
    break;
  case '\x04':
    *obj = (DObject *)0x0;
    break;
  case '\x05':
    (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,(long)&uStack_38 + 5,1);
    if (this->m_HubTravel == true) {
      pPVar3 = ReadStoredClass(this,wanttype);
      *obj = (DObject *)(&players)[(uStack_38 >> 0x28 & 0xff) * 0x54];
      this_00 = PClass::CreateNew(pPVar3);
      pDVar5 = *obj;
      if (*obj == (DObject *)0x0) {
        pDVar5 = this_00;
      }
      TArray<DObject_*,_DObject_*>::Grow(&this->ArchiveToObject,1);
      uVar7 = (this->ArchiveToObject).Count;
      (this->ArchiveToObject).Array[uVar7] = pDVar5;
      (this->ArchiveToObject).Count = uVar7 + 1;
      pNVar4 = TMap<DObject_*,_unsigned_int,_THashTraits<DObject_*>,_TValueTraits<unsigned_int>_>::
               GetNode(&this->ObjectToArchive,pDVar5);
      (pNVar4->Pair).Value = uVar7;
      DObject::SerializeUserVars(this_00,this);
      (*this_00->_vptr_DObject[3])(this_00,this);
      DObject::CheckIfSerialized(this_00);
      if (*obj == (DObject *)0x0) {
LAB_004d7742:
        *obj = this_00;
        (&players)[(ulong)uStack_38._5_1_ * 0x54] = this_00;
        return this;
      }
      pDVar5 = (DObject *)this_00[0x16]._vptr_DObject;
      if (pDVar5 == (DObject *)0x0) goto LAB_004d7768;
      cVar1 = *(code *)&pDVar5->ObjectFlags;
      pDVar6 = this_00;
      while (pDVar2 = pDVar5, ((byte)cVar1 & 0x20) == 0) {
        pDVar2[0x1d].GCNext = this_00;
        pDVar5 = (DObject *)pDVar2[0x16]._vptr_DObject;
        if (pDVar5 == (DObject *)0x0) goto LAB_004d7768;
        cVar1 = *(code *)&pDVar5->ObjectFlags;
        pDVar6 = pDVar2;
      }
LAB_004d775b:
      pDVar6[0x16]._vptr_DObject = (_func_int **)0x0;
LAB_004d7768:
      (*this_00->_vptr_DObject[4])(this_00);
      return this;
    }
  case '\x01':
    pPVar3 = ReadStoredClass(this,wanttype);
    pDVar5 = PClass::CreateNew(pPVar3);
    *obj = pDVar5;
    TArray<DObject_*,_DObject_*>::Grow(&this->ArchiveToObject,1);
    uVar7 = (this->ArchiveToObject).Count;
    (this->ArchiveToObject).Array[uVar7] = pDVar5;
    (this->ArchiveToObject).Count = uVar7 + 1;
    pNVar4 = TMap<DObject_*,_unsigned_int,_THashTraits<DObject_*>,_TValueTraits<unsigned_int>_>::
             GetNode(&this->ObjectToArchive,pDVar5);
    (pNVar4->Pair).Value = uVar7;
    DObject::SerializeUserVars(*obj,this);
    (*(*obj)->_vptr_DObject[3])(*obj,this);
    pDVar5 = *obj;
LAB_004d772b:
    DObject::CheckIfSerialized(pDVar5);
    break;
  case '\x06':
    (*this->_vptr_FArchive[(ulong)(this->m_Storing ^ 1) + 2])(this,(long)&uStack_38 + 5,1);
    if (this->m_HubTravel == true) {
      pPVar3 = ReadClass(this,wanttype);
      *obj = (DObject *)(&players)[(uStack_38 >> 0x28 & 0xff) * 0x54];
      this_00 = PClass::CreateNew(pPVar3);
      pDVar5 = *obj;
      if (*obj == (DObject *)0x0) {
        pDVar5 = this_00;
      }
      TArray<DObject_*,_DObject_*>::Grow(&this->ArchiveToObject,1);
      uVar7 = (this->ArchiveToObject).Count;
      (this->ArchiveToObject).Array[uVar7] = pDVar5;
      (this->ArchiveToObject).Count = uVar7 + 1;
      pNVar4 = TMap<DObject_*,_unsigned_int,_THashTraits<DObject_*>,_TValueTraits<unsigned_int>_>::
               GetNode(&this->ObjectToArchive,pDVar5);
      (pNVar4->Pair).Value = uVar7;
      DObject::SerializeUserVars(this_00,this);
      (*this_00->_vptr_DObject[3])(this_00,this);
      DObject::CheckIfSerialized(this_00);
      if (*obj == (DObject *)0x0) goto LAB_004d7742;
      pDVar5 = (DObject *)this_00[0x16]._vptr_DObject;
      if (pDVar5 == (DObject *)0x0) goto LAB_004d7768;
      cVar1 = *(code *)&pDVar5->ObjectFlags;
      pDVar6 = this_00;
      while (pDVar2 = pDVar5, ((byte)cVar1 & 0x20) == 0) {
        pDVar2[0x1d].GCNext = this_00;
        pDVar5 = (DObject *)pDVar2[0x16]._vptr_DObject;
        if (pDVar5 == (DObject *)0x0) goto LAB_004d7768;
        cVar1 = *(code *)&pDVar5->ObjectFlags;
        pDVar6 = pDVar2;
      }
      goto LAB_004d775b;
    }
    goto switchD_004d73de_caseD_2;
  default:
    if (uStack_38._7_1_ == ',') {
      *obj = (DObject *)0xffffffffffffffff;
    }
    else {
      I_Error("Unknown object code (%d) in archive\n");
    }
  }
  return this;
switchD_004d73de_caseD_2:
  pPVar3 = ReadClass(this,wanttype);
  pDVar5 = PClass::CreateNew(pPVar3);
  *obj = pDVar5;
  TArray<DObject_*,_DObject_*>::Grow(&this->ArchiveToObject,1);
  uVar7 = (this->ArchiveToObject).Count;
  (this->ArchiveToObject).Array[uVar7] = pDVar5;
  (this->ArchiveToObject).Count = uVar7 + 1;
  pNVar4 = TMap<DObject_*,_unsigned_int,_THashTraits<DObject_*>,_TValueTraits<unsigned_int>_>::
           GetNode(&this->ObjectToArchive,pDVar5);
  (pNVar4->Pair).Value = uVar7;
  DObject::SerializeUserVars(pDVar5,this);
  (*pDVar5->_vptr_DObject[3])(pDVar5,this);
  goto LAB_004d772b;
}

Assistant:

FArchive &FArchive::ReadObject (DObject* &obj, PClass *wanttype)
{
	BYTE objHead;
	const PClass *type;
	BYTE playerNum;
	DWORD index;
	DObject *newobj;

	operator<< (objHead);

	switch (objHead)
	{
	case NULL_OBJ:
		obj = NULL;
		break;

	case M1_OBJ:
		obj = (DObject *)~0;
		break;

	case OLD_OBJ:
		index = ReadCount();
		if (index >= ArchiveToObject.Size())
		{
			I_Error ("Object reference too high (%u; max is %u)\n", index, ArchiveToObject.Size());
		}
		obj = ArchiveToObject[index];
		break;

	case NEW_PLYR_CLS_OBJ:
		operator<< (playerNum);
		if (m_HubTravel)
		{
			// If travelling inside a hub, use the existing player actor
			type = ReadClass (wanttype);
//			Printf ("New player class: %s (%u)\n", type->Name, m_File->Tell());
			obj = players[playerNum].mo;

			// But also create a new one so that we can get past the one
			// stored in the archive.
			AActor *tempobj = static_cast<AActor *>(type->CreateNew ());
			MapObject (obj != NULL ? obj : tempobj);
			tempobj->SerializeUserVars (*this);
			tempobj->Serialize (*this);
			tempobj->CheckIfSerialized ();
			// If this player is not present anymore, keep the new body
			// around just so that the load will succeed.
			if (obj != NULL)
			{
				// When the temporary player's inventory items were loaded,
				// they became owned by the real player. Undo that now.
				for (AInventory *item = tempobj->Inventory; item != NULL; item = item->Inventory)
				{
					item->Owner = tempobj;
				}
				tempobj->Destroy ();
			}
			else
			{
				obj = tempobj;
				players[playerNum].mo = static_cast<APlayerPawn *>(obj);
			}
			break;
		}
		/* fallthrough when not travelling to a previous level */
	case NEW_CLS_OBJ:
		type = ReadClass (wanttype);
//		Printf ("New class: %s (%u)\n", type->Name, m_File->Tell());
		newobj = obj = type->CreateNew ();
		MapObject (obj);
		newobj->SerializeUserVars (*this);
		newobj->Serialize (*this);
		newobj->CheckIfSerialized ();
		break;

	case NEW_PLYR_OBJ:
		operator<< (playerNum);
		if (m_HubTravel)
		{
			type = ReadStoredClass (wanttype);
//			Printf ("Use player class: %s (%u)\n", type->Name, m_File->Tell());
			obj = players[playerNum].mo;

			AActor *tempobj = static_cast<AActor *>(type->CreateNew ());
			MapObject (obj != NULL ? obj : tempobj);
			tempobj->SerializeUserVars (*this);
			tempobj->Serialize (*this);
			tempobj->CheckIfSerialized ();
			if (obj != NULL)
			{
				for (AInventory *item = tempobj->Inventory;
					item != NULL; item = item->Inventory)
				{
					item->Owner = tempobj;
				}
				tempobj->Destroy ();
			}
			else
			{
				obj = tempobj;
				players[playerNum].mo = static_cast<APlayerPawn *>(obj);
			}
			break;
		}
		/* fallthrough when not travelling to a previous level */
	case NEW_OBJ:
		type = ReadStoredClass (wanttype);
//		Printf ("Use class: %s (%u)\n", type->Name, m_File->Tell());
		obj = type->CreateNew ();
		MapObject (obj);
		obj->SerializeUserVars (*this);
		obj->Serialize (*this);
		obj->CheckIfSerialized ();
		break;

	default:
		I_Error ("Unknown object code (%d) in archive\n", objHead);
	}
	return *this;
}